

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

BoundsCheck *
wasm::makeArrayBoundsCheck
          (BoundsCheck *__return_storage_ptr__,Expression *ref,Expression *index,Function *func,
          Builder *builder,Expression *length)

{
  uintptr_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  Index IVar6;
  Index IVar7;
  Type TVar8;
  Type TVar9;
  undefined1 *puVar10;
  Type TVar11;
  undefined1 *puVar12;
  Expression *pEVar13;
  Type local_50;
  Type refType;
  BoundsCheck *local_40;
  
  local_50.id = (ref->type).id;
  TVar11.id = (uintptr_t)builder;
  bVar5 = Type::isExact(&local_50);
  if (bVar5) {
    local_50 = Type::with(&local_50,Inexact);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_50.id;
  IVar6 = Builder::addVar((Builder *)func,(Function *)0x0,(Name)(auVar2 << 0x40),TVar11);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (index->type).id;
  refType.id._4_4_ = Builder::addVar((Builder *)func,(Function *)0x0,(Name)(auVar3 << 0x40),TVar11);
  TVar8.id = (uintptr_t)MixedArena::allocSpace(&builder->wasm->allocator,0x20,8);
  *(undefined1 *)TVar8.id = 9;
  *(undefined8 *)(TVar8.id + 8) = 0;
  *(Index *)(TVar8.id + 0x10) = IVar6;
  *(Expression **)(TVar8.id + 0x18) = ref;
  wasm::LocalSet::makeTee(TVar8);
  TVar9.id = (uintptr_t)MixedArena::allocSpace(&builder->wasm->allocator,0x20,8);
  *(undefined1 *)TVar9.id = 9;
  *(undefined8 *)(TVar9.id + 8) = 0;
  *(Index *)(TVar9.id + 0x10) = refType.id._4_4_;
  *(Expression **)(TVar9.id + 0x18) = index;
  wasm::LocalSet::makeTee(TVar9);
  puVar10 = (undefined1 *)MixedArena::allocSpace(&builder->wasm->allocator,0x18,8);
  *puVar10 = 0x4c;
  *(undefined8 *)(puVar10 + 8) = 0;
  *(uintptr_t *)(puVar10 + 0x10) = TVar8.id;
  wasm::ArrayLen::finalize();
  if (length == (Expression *)0x0) {
    local_40 = (BoundsCheck *)0x0;
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (length->type).id;
    IVar7 = Builder::addVar((Builder *)func,(Function *)0x0,(Name)(auVar4 << 0x40),TVar11);
    TVar11.id = (uintptr_t)MixedArena::allocSpace(&builder->wasm->allocator,0x20,8);
    *(undefined1 *)TVar11.id = 9;
    *(undefined8 *)(TVar11.id + 8) = 0;
    *(Index *)(TVar11.id + 0x10) = IVar7;
    *(Expression **)(TVar11.id + 0x18) = length;
    wasm::LocalSet::makeTee(TVar11);
    puVar12 = (undefined1 *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
    *puVar12 = 0x10;
    *(undefined8 *)(puVar12 + 8) = 0;
    *(undefined4 *)(puVar12 + 0x10) = 0;
    *(uintptr_t *)(puVar12 + 0x18) = TVar9.id;
    *(uintptr_t *)(puVar12 + 0x20) = TVar11.id;
    wasm::Binary::finalize();
    pEVar13 = (Expression *)(length->type).id;
    local_40 = (BoundsCheck *)MixedArena::allocSpace(&builder->wasm->allocator,0x18,8);
    *(undefined1 *)&local_40->condition = 8;
    *(Index *)&local_40->getIndex = IVar7;
    local_40->getRef = pEVar13;
    TVar9.id = (uintptr_t)puVar12;
  }
  pEVar13 = (Expression *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  pEVar13->_id = BinaryId;
  (pEVar13->type).id = 0;
  *(undefined4 *)(pEVar13 + 1) = 0x12;
  pEVar13[1].type.id = TVar9.id;
  *(undefined1 **)(pEVar13 + 2) = puVar10;
  wasm::Binary::finalize();
  TVar11.id = local_50.id;
  __return_storage_ptr__->condition = pEVar13;
  pEVar13 = (Expression *)MixedArena::allocSpace(&builder->wasm->allocator,0x18,8);
  pEVar13->_id = LocalGetId;
  *(Index *)(pEVar13 + 1) = IVar6;
  (pEVar13->type).id = TVar11.id;
  __return_storage_ptr__->getRef = pEVar13;
  uVar1 = (index->type).id;
  pEVar13 = (Expression *)MixedArena::allocSpace(&builder->wasm->allocator,0x18,8);
  pEVar13->_id = LocalGetId;
  *(Index *)(pEVar13 + 1) = refType.id._4_4_;
  (pEVar13->type).id = uVar1;
  __return_storage_ptr__->getIndex = pEVar13;
  __return_storage_ptr__->getLength = (Expression *)local_40;
  return local_40;
}

Assistant:

static auto makeArrayBoundsCheck(Expression* ref,
                                 Expression* index,
                                 Function* func,
                                 Builder& builder,
                                 Expression* length = nullptr) {
  // The reference might be a RefNull, in which case its type is exact. But we
  // want to avoid creating exact-typed locals until we support them more widely
  // in the fuzzer, so adjust the type. TODO: remove this once exact references
  // are better supported.
  Type refType = ref->type;
  if (refType.isExact()) {
    refType = refType.with(Inexact);
  }
  auto tempRef = builder.addVar(func, refType);
  auto tempIndex = builder.addVar(func, index->type);
  auto* teeRef = builder.makeLocalTee(tempRef, ref, refType);
  auto* teeIndex = builder.makeLocalTee(tempIndex, index, index->type);
  auto* getSize = builder.makeArrayLen(teeRef);

  Expression* effectiveIndex = teeIndex;

  Expression* getLength = nullptr;
  if (length) {
    // Store the length so we can reuse it.
    auto tempLength = builder.addVar(func, length->type);
    auto* teeLength = builder.makeLocalTee(tempLength, length, length->type);
    // The effective index will now include the length.
    effectiveIndex = builder.makeBinary(AddInt32, effectiveIndex, teeLength);
    getLength = builder.makeLocalGet(tempLength, length->type);
  }

  struct BoundsCheck {
    // A condition that checks if the index is in bounds.
    Expression* condition;
    // An additional use of the reference (we stored the reference in a local,
    // so this reads from that local).
    Expression* getRef;
    // An additional use of the index (as with the ref, it reads from a local).
    Expression* getIndex;
    // An additional use of the length, if it was provided.
    Expression* getLength = nullptr;
  } result = {builder.makeBinary(LtUInt32, effectiveIndex, getSize),
              builder.makeLocalGet(tempRef, refType),
              builder.makeLocalGet(tempIndex, index->type),
              getLength};
  return result;
}